

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

size_t __thiscall Potassco::EnumClass::convert(EnumClass *this,char *x,int *out)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  StringSpan k;
  StringSpan local_48;
  int local_38 [2];
  
  local_48.first = x;
  bVar2 = parseSigned(&local_48.first,(longlong *)local_38,-0x80000000,0x7fffffff);
  pcVar1 = local_48.first;
  if ((bVar2) && (bVar2 = isValid(this,local_38[0]), bVar2)) {
    *out = local_38[0];
    sVar4 = (long)pcVar1 - (long)x;
  }
  else if (pcVar1 == x) {
    sVar3 = strcspn(x," ,=");
    local_48.first = x;
    local_48.size = sVar3;
    bVar2 = detail::find_kv(this,&local_48,(int *)0x0,(StringSpan *)0x0,out);
    sVar4 = 0;
    if (bVar2) {
      sVar4 = sVar3;
    }
  }
  else {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

size_t EnumClass::convert(const char* x, int& out) const {
	int cVal; const char* next;
	if (xconvert(x, cVal, &next, ',') && isValid(cVal)) {
		out = cVal;
		return static_cast<size_t>(next - x);
	}
	else if (x == next) {
		StringSpan k = toSpan(x, std::strcspn(x, " ,="));
		return detail::find_kv(*this, &k, 0, 0, &out) ? k.size : 0;
	}
	else { return static_cast<size_t>(0); }
}